

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_CheckFakeFloorTriggers(AActor *mo,double oldz,bool oldz_has_viewheight)

{
  TObjPtr<ASectorAction> *obj;
  sector_t *psVar1;
  ASectorAction *pAVar2;
  double *pdVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  if ((mo->player != (player_t *)0x0) && ((mo->player->cheats & 0x2000) != 0)) {
    return;
  }
  psVar1 = mo->Sector;
  if (psVar1 == (sector_t *)0x0) {
    __assert_fail("sec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0xb90,"void P_CheckFakeFloorTriggers(AActor *, double, bool)");
  }
  if (psVar1->heightsec == (sector_t *)0x0) {
    return;
  }
  obj = &psVar1->SecActTarget;
  pAVar2 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
  if (pAVar2 == (ASectorAction *)0x0) {
    return;
  }
  psVar1 = psVar1->heightsec;
  dVar5 = secplane_t::ZatPoint(&psVar1->floorplane,mo);
  pdVar3 = &mo->Height;
  if (mo->player != (player_t *)0x0) {
    pdVar3 = &mo->player->viewheight;
  }
  dVar6 = *pdVar3;
  if ((dVar5 < oldz) && ((mo->__Pos).Z <= dVar5)) {
    pAVar2 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
    ASectorAction::TriggerAction(pAVar2,mo,0x400);
  }
  if (!oldz_has_viewheight) {
    oldz = oldz + dVar6;
  }
  dVar6 = dVar6 + (mo->__Pos).Z;
  if ((dVar5 < oldz) || (iVar4 = 0x80, dVar6 <= dVar5)) {
    if ((oldz <= dVar5) || (dVar5 < dVar6)) goto LAB_004297ff;
    iVar4 = 0x40;
  }
  pAVar2 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
  ASectorAction::TriggerAction(pAVar2,mo,iVar4);
LAB_004297ff:
  if (((psVar1->MoreFlags & 2) == 0) &&
     (((dVar5 = secplane_t::ZatPoint(&psVar1->ceilingplane,mo), oldz <= dVar5 &&
       (iVar4 = 0x200, dVar5 < dVar6)) || ((dVar5 < oldz && (iVar4 = 0x100, dVar6 <= dVar5)))))) {
    pAVar2 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
    ASectorAction::TriggerAction(pAVar2,mo,iVar4);
    return;
  }
  return;
}

Assistant:

void P_CheckFakeFloorTriggers (AActor *mo, double oldz, bool oldz_has_viewheight)
{
	if (mo->player && (mo->player->cheats & CF_PREDICTING))
	{
		return;
	}
	sector_t *sec = mo->Sector;
	assert (sec != NULL);
	if (sec == NULL)
	{
		return;
	}
	if (sec->heightsec != NULL && sec->SecActTarget != NULL)
	{
		sector_t *hs = sec->heightsec;
		double waterz = hs->floorplane.ZatPoint(mo);
		double newz;
		double viewheight;

		if (mo->player != NULL)
		{
			viewheight = mo->player->viewheight;
		}
		else
		{
			viewheight = mo->Height;
		}

		if (oldz > waterz && mo->Z() <= waterz)
		{ // Feet hit fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_HitFakeFloor);
		}

		newz = mo->Z() + viewheight;
		if (!oldz_has_viewheight)
		{
			oldz += viewheight;
		}

		if (oldz <= waterz && newz > waterz)
		{ // View went above fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesSurface);
		}
		else if (oldz > waterz && newz <= waterz)
		{ // View went below fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			waterz = hs->ceilingplane.ZatPoint(mo);
			if (oldz <= waterz && newz > waterz)
			{ // View went above fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesAboveC);
			}
			else if (oldz > waterz && newz <= waterz)
			{ // View went below fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesBelowC);
			}
		}
	}
}